

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

Instruction * __thiscall spvtools::opt::Instruction::Clone(Instruction *this,IRContext *c)

{
  bool bVar1;
  uint32_t uVar2;
  Instruction *this_00;
  reference this_01;
  Instruction *i;
  iterator __end2;
  iterator __begin2;
  vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_> *__range2;
  Instruction *clone;
  IRContext *c_local;
  Instruction *this_local;
  
  this_00 = (Instruction *)operator_new(0x70);
  Instruction(this_00,c);
  this_00->opcode_ = this->opcode_;
  this_00->has_type_id_ = (bool)(this->has_type_id_ & 1);
  this_00->has_result_id_ = (bool)(this->has_result_id_ & 1);
  uVar2 = IRContext::TakeNextUniqueId(c);
  this_00->unique_id_ = uVar2;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::operator=
            (&this_00->operands_,&this->operands_);
  std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::operator=
            (&this_00->dbg_line_insts_,&this->dbg_line_insts_);
  __end2 = std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::
           begin(&this_00->dbg_line_insts_);
  i = (Instruction *)
      std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::end
                (&this_00->dbg_line_insts_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<spvtools::opt::Instruction_*,_std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>_>
                                     *)&i), bVar1) {
    this_01 = __gnu_cxx::
              __normal_iterator<spvtools::opt::Instruction_*,_std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>_>
              ::operator*(&__end2);
    uVar2 = IRContext::TakeNextUniqueId(c);
    this_01->unique_id_ = uVar2;
    bVar1 = IsDebugLineInst(this_01);
    if (bVar1) {
      uVar2 = IRContext::TakeNextId(c);
      SetResultId(this_01,uVar2);
    }
    __gnu_cxx::
    __normal_iterator<spvtools::opt::Instruction_*,_std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>_>
    ::operator++(&__end2);
  }
  this_00->dbg_scope_ = this->dbg_scope_;
  return this_00;
}

Assistant:

Instruction* Instruction::Clone(IRContext* c) const {
  Instruction* clone = new Instruction(c);
  clone->opcode_ = opcode_;
  clone->has_type_id_ = has_type_id_;
  clone->has_result_id_ = has_result_id_;
  clone->unique_id_ = c->TakeNextUniqueId();
  clone->operands_ = operands_;
  clone->dbg_line_insts_ = dbg_line_insts_;
  for (auto& i : clone->dbg_line_insts_) {
    i.unique_id_ = c->TakeNextUniqueId();
    if (i.IsDebugLineInst()) i.SetResultId(c->TakeNextId());
  }
  clone->dbg_scope_ = dbg_scope_;
  return clone;
}